

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareScalingFactorWithUnitBasedOnUnknownUnit_Test::TestBody
          (Units_compareScalingFactorWithUnitBasedOnUnknownUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_78;
  double local_70;
  long *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_58 [2];
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38 [2];
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"apple","");
  local_48 = (string *)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  libcellml::Units::addUnit(local_28,(int)&local_68,1.0,1.0,(string *)0x0);
  if (local_48 != (string *)local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_48;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  psVar1 = local_48;
  pcVar3 = "";
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x10,1.0,1.0,(string *)0x0);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_78 = (long *)0x0;
  local_70 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_28,(shared_ptr *)&local_48,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_68,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)&local_78,&local_70);
  if (local_68._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x455,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78 = (long *)0x0;
  local_70 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_48,(shared_ptr *)&local_28,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_68,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)&local_78,&local_70);
  if (local_68._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x456,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithUnitBasedOnUnknownUnit)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}